

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::timedOut(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  DateTime *rhs;
  IntField *this_00;
  UtcTimeStamp *now_local;
  SessionState *this_local;
  
  rhs = &lastReceivedTime(this)->super_DateTime;
  iVar1 = FIX::operator-(&now->super_DateTime,rhs);
  this_00 = &heartBtInt(this)->super_IntField;
  iVar2 = IntField::operator_cast_to_int(this_00);
  return (double)iVar2 * 2.4 <= (double)iVar1;
}

Assistant:

bool timedOut(const UtcTimeStamp &now) const { return (now - lastReceivedTime()) >= (2.4 * (double)heartBtInt()); }